

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O1

int field_is_flat(FMFormat_conflict f,FMTypeDesc *t)

{
  FMTypeEnum FVar1;
  
  for (; FVar1 = t->type, FVar1 == FMType_array; t = t->next) {
  }
  if (FVar1 != FMType_subformat) {
    if (FVar1 == FMType_simple) {
      return 1;
    }
    return 0;
  }
  return (int)(f->field_subformats[t->field_index]->variant == 0);
}

Assistant:

extern int
field_is_flat(FMFormat f, FMTypeDesc *t)
{
    switch (t->type) {
    case FMType_pointer:
	return FALSE;
    case FMType_array:
	return field_is_flat(f, t->next);
    case FMType_string:
	return FALSE;
    case FMType_subformat:
	return !f->field_subformats[t->field_index]->variant;
    case FMType_simple:
	return TRUE;
    default:
	assert(FALSE);
    }
    /* notreached */
    return FALSE;
}